

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

Belief * __thiscall
despot::BaseRockSample::Tau(BaseRockSample *this,Belief *belief,ACT_TYPE action,OBS_TYPE obs)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  ParticleBelief *pPVar4;
  ostream *poVar5;
  int i;
  ulong uVar6;
  long lVar7;
  double dVar8;
  vector<despot::State_*,_std::allocator<despot::State_*>_> new_particles;
  State *new_particle;
  double local_90;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_88;
  Belief *local_68;
  OBS_TYPE local_60;
  double local_58;
  value_type local_50;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_48;
  
  local_60 = obs;
  if (Tau(despot::Belief_const*,int,unsigned_long)::probs == '\0') {
    iVar1 = __cxa_guard_acquire(&Tau(despot::Belief_const*,int,unsigned_long)::probs);
    if (iVar1 != 0) {
      iVar1 = (**(code **)(*(long *)this + 0x10))(this);
      std::vector<double,_std::allocator<double>_>::vector
                (&Tau::probs,(long)iVar1,(allocator_type *)&local_88);
      __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,&Tau::probs,&__dso_handle);
      __cxa_guard_release(&Tau(despot::Belief_const*,int,unsigned_long)::probs);
    }
  }
  local_68 = belief;
  plVar3 = (long *)(**(code **)(*(long *)belief + 0x30))(belief);
  local_90 = 0.0;
  uVar6 = 0;
  while( true ) {
    if ((ulong)(plVar3[1] - *plVar3 >> 3) <= uVar6) break;
    lVar7 = *(long *)(*plVar3 + uVar6 * 8);
    iVar1 = NextState(this,*(int *)(lVar7 + 0xc),action);
    iVar2 = (**(code **)(*(long *)this + 0x10))(this);
    if (iVar1 != iVar2 + -1) {
      local_58 = *(double *)(lVar7 + 0x18);
      dVar8 = (double)(**(code **)(*(long *)this + 0x48))
                                (this,local_60,
                                 (this->states_).
                                 super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar1],action);
      local_90 = local_90 + dVar8 * local_58;
      Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[iVar1] =
           dVar8 * local_58 +
           Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar1];
    }
    uVar6 = uVar6 + 1;
  }
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar7 = 0;
  while( true ) {
    iVar1 = (**(code **)(*(long *)this + 0x10))(this);
    if (iVar1 <= lVar7) break;
    if (0.0 < Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7]) {
      local_50 = (value_type)
                 (**(code **)(*(long *)this + 0xc0))
                           (this,(this->states_).
                                 super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar7]);
      *(double *)(local_50 + 0x18) =
           Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar7] / local_90;
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_88,&local_50);
      Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar7] = 0.0;
    }
    lVar7 = lVar7 + 1;
  }
  if (local_88._M_impl.super__Vector_impl_data._M_finish !=
      local_88._M_impl.super__Vector_impl_data._M_start) {
    pPVar4 = (ParticleBelief *)operator_new(0x90);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_48,
               (vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_88);
    despot::ParticleBelief::ParticleBelief(pPVar4,&local_48,&this->super_BeliefMDP,0,0);
    std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_48);
    std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_88);
    return (Belief *)pPVar4;
  }
  poVar5 = (ostream *)despot::operator<<((ostream *)&std::cout,local_68);
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(0);
}

Assistant:

Belief* BaseRockSample::Tau(const Belief* belief, ACT_TYPE action,
	OBS_TYPE obs) const {
	static vector<double> probs = vector<double>(NumStates());

	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double sum = 0;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		RockSampleState* state = static_cast<RockSampleState*>(particle);
		int id = NextState(state->state_id, action);

		if (id == NumStates() - 1)
			continue; // ignore terminal state

		const RockSampleState& next = *(states_[id]);
		double p = state->weight * ObsProb(obs, next, action);
		probs[id] += p;
		sum += p;
	}

	vector<State*> new_particles;
	for (int i = 0; i < NumStates(); i++) {
		if (probs[i] > 0) {
			State* new_particle = Copy(states_[i]);
			new_particle->weight = probs[i] / sum;
			new_particles.push_back(new_particle);
			probs[i] = 0;
		}
	}

	if (new_particles.size() == 0) {
		cout << *belief << endl;
		exit(0);
	}

	return new ParticleBelief(new_particles, this, NULL, false);
}